

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_partition_tables.cpp
# Opt level: O0

void build_partition_table_for_one_partition_count
               (block_size_descriptor *bsd,bool can_omit_partitionings,uint partition_count_cutoff,
               uint partition_count,partition_info *ptab,uint64_t *canonical_patterns)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint in_ECX;
  uint in_EDX;
  byte in_SIL;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool match;
  uint j;
  bool keep_canonical;
  bool keep_useful;
  uint i;
  uint x;
  uint8_t build [1024];
  uint max_iter;
  uint next_index;
  uint local_448;
  uint local_440;
  uint local_43c;
  char local_438 [72];
  partition_info *in_stack_fffffffffffffc10;
  uint in_stack_fffffffffffffc1c;
  uint in_stack_fffffffffffffc20;
  uint in_stack_fffffffffffffc24;
  block_size_descriptor *in_stack_fffffffffffffc28;
  uint local_2c;
  
  local_2c = 0;
  *(undefined4 *)(in_RDI + 0x20 + (ulong)(in_ECX - 1) * 4) = 0;
  *(undefined4 *)(in_RDI + 0x30 + (ulong)(in_ECX - 1) * 4) = 0;
  if (((in_SIL & 1) == 0) || (in_ECX <= in_EDX)) {
    uVar4 = 2;
    if ((in_SIL & 1) != 0) {
      uVar4 = 1;
    }
    memset(local_438,0,0x400);
    for (local_43c = 0; local_43c < uVar4; local_43c = local_43c + 1) {
      for (local_440 = 0; local_440 < 0x400; local_440 = local_440 + 1) {
        if (((local_43c != 1) || (local_438[local_440] == '\0')) &&
           ((bVar2 = generate_one_partition_info_entry
                               (in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,
                                in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c,
                                in_stack_fffffffffffffc10), local_43c != 0 || (bVar2)))) {
          generate_canonical_partitioning
                    ((uint)*(byte *)(in_RDI + 3),(uint8_t *)(in_R8 + (ulong)local_2c * 0x460 + 0x20)
                     ,(uint64_t *)(in_R9 + (ulong)(local_2c * 7) * 8));
          bVar1 = true;
          for (local_448 = 0; local_448 < local_2c; local_448 = local_448 + 1) {
            bVar3 = compare_canonical_partitionings
                              ((uint64_t *)(in_R9 + (ulong)(local_2c * 7) * 8),
                               (uint64_t *)(in_R9 + (ulong)(local_448 * 7) * 8));
            if (bVar3) {
              bVar1 = false;
              break;
            }
          }
          if ((bVar2) && (bVar1)) {
            if (local_43c == 0) {
              *(short *)(in_RDI + 0xe13f40 + (ulong)(in_ECX - 2) * 0x800 + (ulong)local_440 * 2) =
                   (short)local_2c;
              *(int *)(in_RDI + 0x20 + (ulong)(in_ECX - 1) * 4) =
                   *(int *)(in_RDI + 0x20 + (ulong)(in_ECX - 1) * 4) + 1;
              *(int *)(in_RDI + 0x30 + (ulong)(in_ECX - 1) * 4) =
                   *(int *)(in_RDI + 0x30 + (ulong)(in_ECX - 1) * 4) + 1;
              local_438[local_440] = '\x01';
              local_2c = local_2c + 1;
            }
          }
          else if (local_43c == 1) {
            *(short *)(in_RDI + 0xe13f40 + (ulong)(in_ECX - 2) * 0x800 + (ulong)local_440 * 2) =
                 (short)local_2c;
            *(int *)(in_RDI + 0x30 + (ulong)(in_ECX - 1) * 4) =
                 *(int *)(in_RDI + 0x30 + (ulong)(in_ECX - 1) * 4) + 1;
            local_2c = local_2c + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void build_partition_table_for_one_partition_count(
	block_size_descriptor& bsd,
	bool can_omit_partitionings,
	unsigned int partition_count_cutoff,
	unsigned int partition_count,
	partition_info* ptab,
	uint64_t* canonical_patterns
) {
	unsigned int next_index = 0;
	bsd.partitioning_count_selected[partition_count - 1] = 0;
	bsd.partitioning_count_all[partition_count - 1] = 0;

	// Skip tables larger than config max partition count if we can omit modes
	if (can_omit_partitionings && (partition_count > partition_count_cutoff))
	{
		return;
	}

	// Iterate through twice
	//   - Pass 0: Keep selected partitionings
	//   - Pass 1: Keep non-selected partitionings (skip if in omit mode)
	unsigned int max_iter = can_omit_partitionings ? 1 : 2;

	// Tracker for things we built in the first iteration
	uint8_t build[BLOCK_MAX_PARTITIONINGS] { 0 };
	for (unsigned int x = 0; x < max_iter; x++)
	{
		for (unsigned int i = 0; i < BLOCK_MAX_PARTITIONINGS; i++)
		{
			// Don't include things we built in the first pass
			if ((x == 1) && build[i])
			{
				continue;
			}

			bool keep_useful = generate_one_partition_info_entry(bsd, partition_count, i, next_index, ptab[next_index]);
			if ((x == 0) && !keep_useful)
			{
				continue;
			}

			generate_canonical_partitioning(bsd.texel_count, ptab[next_index].partition_of_texel, canonical_patterns + next_index * BIT_PATTERN_WORDS);
			bool keep_canonical = true;
			for (unsigned int j = 0; j < next_index; j++)
			{
				bool match = compare_canonical_partitionings(canonical_patterns + next_index * BIT_PATTERN_WORDS, canonical_patterns +  j * BIT_PATTERN_WORDS);
				if (match)
				{
					keep_canonical = false;
					break;
				}
			}

			if (keep_useful && keep_canonical)
			{
				if (x == 0)
				{
					bsd.partitioning_packed_index[partition_count - 2][i] = static_cast<uint16_t>(next_index);
					bsd.partitioning_count_selected[partition_count - 1]++;
					bsd.partitioning_count_all[partition_count - 1]++;
					build[i] = 1;
					next_index++;
				}
			}
			else
			{
				if (x == 1)
				{
					bsd.partitioning_packed_index[partition_count - 2][i] = static_cast<uint16_t>(next_index);
					bsd.partitioning_count_all[partition_count - 1]++;
					next_index++;
				}
			}
		}
	}
}